

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

Aig_Man_t * Saig_ManDupFoldConstrsFunc(Aig_Man_t *pAig,int fCompl,int fVerbose)

{
  char *pcVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *pAVar4;
  size_t sVar5;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  Aig_Obj_t *pAVar11;
  int iVar12;
  long lVar13;
  
  if (pAig->nConstrs == 0) {
    pAVar4 = Aig_ManDupDfs(pAig);
    return pAVar4;
  }
  if (pAig->nTruePos <= pAig->nConstrs) {
    __assert_fail("Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                  ,0x3b5,"Aig_Man_t *Saig_ManDupFoldConstrsFunc(Aig_Man_t *, int, int)");
  }
  pAVar4 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  pcVar1 = pAig->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  pAVar4->pName = pcVar6;
  pcVar1 = pAig->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  pAVar4->pSpec = pcVar6;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar4->pConst1;
  pVVar9 = pAig->vCis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar13];
      pAVar7 = Aig_ObjCreateCi(pAVar4);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      lVar13 = lVar13 + 1;
      pVVar9 = pAig->vCis;
    } while (lVar13 < pVVar9->nSize);
  }
  pVVar9 = pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar13];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006e4b45;
        uVar8 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        uVar8 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar7 = Aig_And(pAVar4,pAVar7,pAVar11);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
        pVVar9 = pAig->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  pAVar7 = (Aig_Obj_t *)((ulong)pAVar4->pConst1 ^ 1);
  iVar12 = pAig->nTruePos;
  if (0 < iVar12) {
    lVar13 = 0;
    do {
      if (pAig->vCos->nSize <= lVar13) goto LAB_006e4b26;
      if ((long)iVar12 - (long)pAig->nConstrs <= lVar13) {
        pvVar2 = pAig->vCos->pArray[lVar13];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006e4b45;
        uVar8 = *(ulong *)((long)pvVar2 + 8);
        uVar10 = uVar8 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar10 + 0x28);
        }
        pAVar7 = Aig_Or(pAVar4,pAVar7,(Aig_Obj_t *)(uVar8 ^ (long)fCompl));
        iVar12 = pAig->nTruePos;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar12);
  }
  if (0 < pAig->nRegs) {
    pAVar11 = Aig_ObjCreateCi(pAVar4);
    pAVar7 = Aig_Or(pAVar4,pAVar7,pAVar11);
    iVar12 = pAig->nTruePos;
  }
  if (0 < iVar12) {
    lVar13 = 0;
    do {
      if (pAig->vCos->nSize <= lVar13) goto LAB_006e4b26;
      if (lVar13 < (long)iVar12 - (long)pAig->nConstrs) {
        pvVar2 = pAig->vCos->pArray[lVar13];
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006e4b45;
        uVar8 = *(ulong *)((long)pvVar2 + 8);
        uVar10 = uVar8 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        pAVar11 = Aig_And(pAVar4,pAVar11,(Aig_Obj_t *)((ulong)pAVar7 ^ 1));
        Aig_ObjCreateCo(pAVar4,pAVar11);
        iVar12 = pAig->nTruePos;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar12);
  }
  if (0 < pAig->nRegs) {
    iVar12 = 0;
    do {
      uVar3 = pAig->nTruePos + iVar12;
      if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) {
LAB_006e4b26:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAig->vCos->pArray[uVar3];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_006e4b45:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar8 = *(ulong *)((long)pvVar2 + 8);
      uVar10 = uVar8 & 0xfffffffffffffffe;
      if (uVar10 == 0) {
        pAVar11 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar11 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar10 + 0x28));
      }
      Aig_ObjCreateCo(pAVar4,pAVar11);
      iVar12 = iVar12 + 1;
    } while (iVar12 < pAig->nRegs);
    if (0 < pAig->nRegs) {
      Aig_ObjCreateCo(pAVar4,pAVar7);
      Aig_ManSetRegNum(pAVar4,pAig->nRegs + 1);
    }
  }
  Aig_ManCleanup(pAVar4);
  Aig_ManSeqCleanup(pAVar4);
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManDupFoldConstrsFunc( Aig_Man_t * pAig, int fCompl, int fVerbose )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pMiter, * pFlopOut, * pFlopIn, * pObj;
    int i;
    if ( Aig_ManConstrNum(pAig) == 0 )
        return Aig_ManDupDfs( pAig );
    assert( Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // OR the constraint outputs
    pMiter = Aig_ManConst0( pAigNew );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
            continue;
        pMiter = Aig_Or( pAigNew, pMiter, Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) );
    }

    // create additional flop
    if ( Saig_ManRegNum(pAig) > 0 )
    {
        pFlopOut = Aig_ObjCreateCi( pAigNew );
        pFlopIn  = Aig_Or( pAigNew, pMiter, pFlopOut );
    }
    else 
        pFlopIn = pMiter;

    // create primary output
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i >= Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
            continue;
        pMiter = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_Not(pFlopIn) );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }

    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );

    // create additional flop 
    if ( Saig_ManRegNum(pAig) > 0 )
    {
        Aig_ObjCreateCo( pAigNew, pFlopIn );
        Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig)+1 );
    }

    // perform cleanup
    Aig_ManCleanup( pAigNew );
    Aig_ManSeqCleanup( pAigNew );
    return pAigNew;
}